

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableMessageFieldLiteGenerator::GenerateMembers
          (RepeatedImmutableMessageFieldLiteGenerator *this,Printer *printer)

{
  Printer *pPVar1;
  FieldDescriptor *pFVar2;
  string_view end_varname;
  string_view end_varname_00;
  string_view end_varname_01;
  string_view end_varname_02;
  string_view end_varname_03;
  Printer *pPVar3;
  Options *pOVar4;
  undefined1 in_R8B;
  undefined1 uVar5;
  string_view local_558;
  undefined1 local_548 [80];
  string_view local_4f8;
  undefined1 local_4e8 [80];
  string_view local_498;
  undefined1 local_488 [80];
  string_view local_438;
  undefined1 local_428 [80];
  string_view local_3d8;
  undefined1 local_3c8 [80];
  string_view local_378;
  undefined1 local_368 [80];
  string_view local_318;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_300;
  basic_string_view<char,_std::char_traits<char>_> local_2f8;
  string_view local_2e8;
  string_view local_2d8;
  FieldDescriptor local_2c8;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_270;
  basic_string_view<char,_std::char_traits<char>_> local_268;
  string_view local_258;
  string_view local_248;
  FieldDescriptor local_238;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_1e0;
  basic_string_view<char,_std::char_traits<char>_> local_1d8;
  string_view local_1c8;
  string_view local_1b8;
  FieldDescriptor local_1a8;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_150;
  basic_string_view<char,_std::char_traits<char>_> local_148;
  string_view local_138;
  string_view local_128;
  FieldDescriptor local_118;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_c0;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  string_view local_a8;
  string_view local_98 [2];
  undefined1 local_78 [80];
  string_view local_28;
  Printer *local_18;
  Printer *printer_local;
  RepeatedImmutableMessageFieldLiteGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_28,"private com.google.protobuf.Internal.ProtobufList<$type$> $name$_;\n");
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&this->variables_,local_28);
  PrintExtraFieldInfo(&this->variables_,local_18);
  pPVar3 = local_18;
  pPVar1 = (Printer *)this->descriptor_;
  pOVar4 = Context::options(this->context_);
  Options::Options((Options *)local_78,pOVar4);
  WriteFieldDocComment
            ((java *)pPVar3,pPVar1,(FieldDescriptor *)local_78,(Options *)0x0,(bool)in_R8B);
  Options::~Options((Options *)local_78);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_98,
             "@java.lang.Override\n$deprecation$public java.util.List<$type$> ${$get$capitalized_name$List$}$() {\n  return $name$_;\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar1,&this->variables_,local_98[0]);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b8,"}");
  pFVar2 = this->descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_c0);
  end_varname_03._M_str = local_b8._M_str;
  end_varname_03._M_len = local_b8._M_len;
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar1,local_a8,end_varname_03,pFVar2,local_c0);
  pPVar3 = local_18;
  uVar5 = SUB81(local_b8._M_str,0);
  pPVar1 = (Printer *)this->descriptor_;
  pOVar4 = Context::options(this->context_);
  Options::Options((Options *)&local_118,pOVar4);
  WriteFieldDocComment((java *)pPVar3,pPVar1,&local_118,(Options *)0x0,(bool)uVar5);
  Options::~Options((Options *)&local_118);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_128,
             "$deprecation$public java.util.List<? extends $type$OrBuilder> \n    ${$get$capitalized_name$OrBuilderList$}$() {\n  return $name$_;\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar1,&this->variables_,local_128);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_138,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_148,"}");
  pFVar2 = this->descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_150);
  end_varname_02._M_str = local_148._M_str;
  end_varname_02._M_len = local_148._M_len;
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar1,local_138,end_varname_02,pFVar2,local_150);
  pPVar3 = local_18;
  uVar5 = SUB81(local_148._M_str,0);
  pPVar1 = (Printer *)this->descriptor_;
  pOVar4 = Context::options(this->context_);
  Options::Options((Options *)&local_1a8,pOVar4);
  WriteFieldDocComment((java *)pPVar3,pPVar1,&local_1a8,(Options *)0x0,(bool)uVar5);
  Options::~Options((Options *)&local_1a8);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1b8,
             "@java.lang.Override\n$deprecation$public int ${$get$capitalized_name$Count$}$() {\n  return $name$_.size();\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar1,&this->variables_,local_1b8);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1c8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1d8,"}");
  pFVar2 = this->descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_1e0);
  end_varname_01._M_str = local_1d8._M_str;
  end_varname_01._M_len = local_1d8._M_len;
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar1,local_1c8,end_varname_01,pFVar2,local_1e0);
  pPVar3 = local_18;
  uVar5 = SUB81(local_1d8._M_str,0);
  pPVar1 = (Printer *)this->descriptor_;
  pOVar4 = Context::options(this->context_);
  Options::Options((Options *)&local_238,pOVar4);
  WriteFieldDocComment((java *)pPVar3,pPVar1,&local_238,(Options *)0x0,(bool)uVar5);
  Options::~Options((Options *)&local_238);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_248,
             "@java.lang.Override\n$deprecation$public $type$ ${$get$capitalized_name$$}$(int index) {\n  return $name$_.get(index);\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar1,&this->variables_,local_248);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_258,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_268,"}");
  pFVar2 = this->descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_270);
  end_varname_00._M_str = local_268._M_str;
  end_varname_00._M_len = local_268._M_len;
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar1,local_258,end_varname_00,pFVar2,local_270);
  pPVar3 = local_18;
  uVar5 = SUB81(local_268._M_str,0);
  pPVar1 = (Printer *)this->descriptor_;
  pOVar4 = Context::options(this->context_);
  Options::Options((Options *)&local_2c8,pOVar4);
  WriteFieldDocComment((java *)pPVar3,pPVar1,&local_2c8,(Options *)0x0,(bool)uVar5);
  Options::~Options((Options *)&local_2c8);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_2d8,
             "$deprecation$public $type$OrBuilder ${$get$capitalized_name$OrBuilder$}$(\n    int index) {\n  return $name$_.get(index);\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar1,&this->variables_,local_2d8);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2e8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2f8,"}");
  pFVar2 = this->descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_300);
  end_varname._M_str = local_2f8._M_str;
  end_varname._M_len = local_2f8._M_len;
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar1,local_2e8,end_varname,pFVar2,local_300);
  pPVar1 = local_18;
  uVar5 = SUB81(local_2f8._M_str,0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_318,
             "private void ensure$capitalized_name$IsMutable() {\n  com.google.protobuf.Internal.ProtobufList<$type$> tmp = $name$_;\n  if (!tmp.isModifiable()) {\n    $name$_ =\n        com.google.protobuf.GeneratedMessageLite.mutableCopy(tmp);\n   }\n}\n\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar1,&this->variables_,local_318);
  pPVar3 = local_18;
  pPVar1 = (Printer *)this->descriptor_;
  pOVar4 = Context::options(this->context_);
  Options::Options((Options *)local_368,pOVar4);
  WriteFieldDocComment
            ((java *)pPVar3,pPVar1,(FieldDescriptor *)local_368,(Options *)0x0,(bool)uVar5);
  Options::~Options((Options *)local_368);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_378,
             "@java.lang.SuppressWarnings(\"ReturnValueIgnored\")\nprivate void set$capitalized_name$(\n    int index, $type$ value) {\n  value.getClass();  // minimal bytecode null check\n  ensure$capitalized_name$IsMutable();\n  $name$_.set(index, value);\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar1,&this->variables_,local_378);
  pPVar3 = local_18;
  pPVar1 = (Printer *)this->descriptor_;
  pOVar4 = Context::options(this->context_);
  Options::Options((Options *)local_3c8,pOVar4);
  WriteFieldDocComment
            ((java *)pPVar3,pPVar1,(FieldDescriptor *)local_3c8,(Options *)0x0,(bool)uVar5);
  Options::~Options((Options *)local_3c8);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_3d8,
             "@java.lang.SuppressWarnings(\"ReturnValueIgnored\")\nprivate void add$capitalized_name$($type$ value) {\n  value.getClass();  // minimal bytecode null check\n  ensure$capitalized_name$IsMutable();\n  $name$_.add(value);\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar1,&this->variables_,local_3d8);
  pPVar3 = local_18;
  pPVar1 = (Printer *)this->descriptor_;
  pOVar4 = Context::options(this->context_);
  Options::Options((Options *)local_428,pOVar4);
  WriteFieldDocComment
            ((java *)pPVar3,pPVar1,(FieldDescriptor *)local_428,(Options *)0x0,(bool)uVar5);
  Options::~Options((Options *)local_428);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_438,
             "@java.lang.SuppressWarnings(\"ReturnValueIgnored\")\nprivate void add$capitalized_name$(\n    int index, $type$ value) {\n  value.getClass();  // minimal bytecode null check\n  ensure$capitalized_name$IsMutable();\n  $name$_.add(index, value);\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar1,&this->variables_,local_438);
  pPVar3 = local_18;
  pPVar1 = (Printer *)this->descriptor_;
  pOVar4 = Context::options(this->context_);
  Options::Options((Options *)local_488,pOVar4);
  WriteFieldDocComment
            ((java *)pPVar3,pPVar1,(FieldDescriptor *)local_488,(Options *)0x0,(bool)uVar5);
  Options::~Options((Options *)local_488);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_498,
             "private void addAll$capitalized_name$(\n    java.lang.Iterable<? extends $type$> values) {\n  ensure$capitalized_name$IsMutable();\n  com.google.protobuf.AbstractMessageLite.addAll(\n      values, $name$_);\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar1,&this->variables_,local_498);
  pPVar3 = local_18;
  pPVar1 = (Printer *)this->descriptor_;
  pOVar4 = Context::options(this->context_);
  Options::Options((Options *)local_4e8,pOVar4);
  WriteFieldDocComment
            ((java *)pPVar3,pPVar1,(FieldDescriptor *)local_4e8,(Options *)0x0,(bool)uVar5);
  Options::~Options((Options *)local_4e8);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_4f8,
             "private void clear$capitalized_name$() {\n  $name$_ = emptyProtobufList();\n}\n");
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar1,&this->variables_,local_4f8);
  pPVar3 = local_18;
  pPVar1 = (Printer *)this->descriptor_;
  pOVar4 = Context::options(this->context_);
  Options::Options((Options *)local_548,pOVar4);
  WriteFieldDocComment
            ((java *)pPVar3,pPVar1,(FieldDescriptor *)local_548,(Options *)0x0,(bool)uVar5);
  Options::~Options((Options *)local_548);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_558,
             "private void remove$capitalized_name$(int index) {\n  ensure$capitalized_name$IsMutable();\n  $name$_.remove(index);\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar1,&this->variables_,local_558);
  return;
}

Assistant:

void RepeatedImmutableMessageFieldLiteGenerator::GenerateMembers(
    io::Printer* printer) const {
  printer->Print(
      variables_,
      "private com.google.protobuf.Internal.ProtobufList<$type$> $name$_;\n");
  PrintExtraFieldInfo(variables_, printer);
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public java.util.List<$type$> "
                 "${$get$capitalized_name$List$}$() {\n"
                 "  return $name$_;\n"  // note:  unmodifiable list
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(
      variables_,
      "$deprecation$public java.util.List<? extends $type$OrBuilder> \n"
      "    ${$get$capitalized_name$OrBuilderList$}$() {\n"
      "  return $name$_;\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(
      variables_,
      "@java.lang.Override\n"
      "$deprecation$public int ${$get$capitalized_name$Count$}$() {\n"
      "  return $name$_.size();\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(
      variables_,
      "@java.lang.Override\n"
      "$deprecation$public $type$ ${$get$capitalized_name$$}$(int index) {\n"
      "  return $name$_.get(index);\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "$deprecation$public $type$OrBuilder "
                 "${$get$capitalized_name$OrBuilder$}$(\n"
                 "    int index) {\n"
                 "  return $name$_.get(index);\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  printer->Print(
      variables_,
      "private void ensure$capitalized_name$IsMutable() {\n"
      // Use a temporary to avoid a redundant iget-object.
      "  com.google.protobuf.Internal.ProtobufList<$type$> tmp = $name$_;\n"
      "  if (!tmp.isModifiable()) {\n"
      "    $name$_ =\n"
      "        com.google.protobuf.GeneratedMessageLite.mutableCopy(tmp);\n"
      "   }\n"
      "}\n"
      "\n");

  // Builder setRepeatedField(int index, Field value)
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "@java.lang.SuppressWarnings(\"ReturnValueIgnored\")\n"
                 "private void set$capitalized_name$(\n"
                 "    int index, $type$ value) {\n"
                 "  value.getClass();  // minimal bytecode null check\n"
                 "  ensure$capitalized_name$IsMutable();\n"
                 "  $name$_.set(index, value);\n"
                 "}\n");

  // Builder addRepeatedField(Field value)
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "@java.lang.SuppressWarnings(\"ReturnValueIgnored\")\n"
                 "private void add$capitalized_name$($type$ value) {\n"
                 "  value.getClass();  // minimal bytecode null check\n"
                 "  ensure$capitalized_name$IsMutable();\n"
                 "  $name$_.add(value);\n"
                 "}\n");

  // Builder addRepeatedField(int index, Field value)
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "@java.lang.SuppressWarnings(\"ReturnValueIgnored\")\n"
                 "private void add$capitalized_name$(\n"
                 "    int index, $type$ value) {\n"
                 "  value.getClass();  // minimal bytecode null check\n"
                 "  ensure$capitalized_name$IsMutable();\n"
                 "  $name$_.add(index, value);\n"
                 "}\n");

  // Builder addAllRepeatedField(Iterable<Field> values)
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "private void addAll$capitalized_name$(\n"
                 "    java.lang.Iterable<? extends $type$> values) {\n"
                 "  ensure$capitalized_name$IsMutable();\n"
                 "  com.google.protobuf.AbstractMessageLite.addAll(\n"
                 "      values, $name$_);\n"
                 "}\n");

  // Builder clearAllRepeatedField()
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "private void clear$capitalized_name$() {\n"
                 "  $name$_ = emptyProtobufList();\n"
                 "}\n");

  // Builder removeRepeatedField(int index)
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "private void remove$capitalized_name$(int index) {\n"
                 "  ensure$capitalized_name$IsMutable();\n"
                 "  $name$_.remove(index);\n"
                 "}\n");
}